

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

int jpc_dec_tilefini(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  jpc_dec_seglist_t *pjVar1;
  jpc_dec_seg_s *pjVar2;
  uint uVar3;
  jpc_dec_seg_t *pjVar4;
  jpc_dec_tcomp_t *pjVar5;
  jpc_dec_seg_s *pjVar6;
  int iVar7;
  jpc_dec_cblk_t *pjVar8;
  jpc_dec_band_t *ptr;
  int iVar9;
  jpc_dec_prc_t *pjVar10;
  jpc_dec_seg_t *seg;
  int iVar11;
  int iVar12;
  jpc_dec_rlvl_t *ptr_00;
  
  pjVar5 = tile->tcomps;
  if ((pjVar5 != (jpc_dec_tcomp_t *)0x0) && (0 < dec->numcomps)) {
    iVar7 = 0;
    do {
      ptr_00 = pjVar5->rlvls;
      if (pjVar5->numrlvls != 0) {
        uVar3 = 0;
        do {
          ptr = ptr_00->bands;
          if (ptr != (jpc_dec_band_t *)0x0) {
            if (0 < ptr_00->numbands) {
              iVar9 = 0;
              do {
                pjVar10 = ptr->prcs;
                if ((pjVar10 != (jpc_dec_prc_t *)0x0) && (0 < ptr_00->numprcs)) {
                  iVar11 = 0;
                  do {
                    pjVar8 = pjVar10->cblks;
                    if (pjVar8 != (jpc_dec_cblk_t *)0x0) {
                      if (0 < pjVar10->numcblks) {
                        iVar12 = 0;
                        do {
                          seg = (pjVar8->segs).head;
                          if (seg != (jpc_dec_seg_t *)0x0) {
                            pjVar1 = &pjVar8->segs;
                            do {
                              pjVar4 = seg->next;
                              pjVar2 = seg->prev;
                              pjVar6 = pjVar2;
                              if (pjVar2 == (jpc_dec_seg_s *)0x0) {
                                pjVar6 = (jpc_dec_seg_s *)pjVar1;
                              }
                              pjVar6->next = pjVar4;
                              if (pjVar4 == (jpc_dec_seg_t *)0x0) {
                                pjVar4 = (jpc_dec_seg_t *)pjVar1;
                              }
                              pjVar4->prev = pjVar2;
                              seg->next = (jpc_dec_seg_s *)0x0;
                              seg->prev = (jpc_dec_seg_s *)0x0;
                              jpc_seg_destroy(seg);
                              seg = pjVar1->head;
                            } while (seg != (jpc_dec_seg_t *)0x0);
                          }
                          jas_matrix_destroy(pjVar8->data);
                          if (pjVar8->mqdec != (jpc_mqdec_t *)0x0) {
                            jpc_mqdec_destroy(pjVar8->mqdec);
                          }
                          if (pjVar8->nulldec != (jpc_bitstream_t *)0x0) {
                            jpc_bitstream_close(pjVar8->nulldec);
                          }
                          if (pjVar8->flags != (jas_matrix_t *)0x0) {
                            jas_matrix_destroy(pjVar8->flags);
                          }
                          iVar12 = iVar12 + 1;
                          pjVar8 = pjVar8 + 1;
                        } while (iVar12 < pjVar10->numcblks);
                      }
                      if (pjVar10->incltagtree != (jpc_tagtree_t *)0x0) {
                        jpc_tagtree_destroy(pjVar10->incltagtree);
                      }
                      if (pjVar10->numimsbstagtree != (jpc_tagtree_t *)0x0) {
                        jpc_tagtree_destroy(pjVar10->numimsbstagtree);
                      }
                      if (pjVar10->cblks != (jpc_dec_cblk_t *)0x0) {
                        jas_free(pjVar10->cblks);
                      }
                    }
                    iVar11 = iVar11 + 1;
                    pjVar10 = pjVar10 + 1;
                  } while (iVar11 < ptr_00->numprcs);
                }
                if (ptr->data != (jas_matrix_t *)0x0) {
                  jas_matrix_destroy(ptr->data);
                }
                if (ptr->prcs != (jpc_dec_prc_t *)0x0) {
                  jas_free(ptr->prcs);
                }
                iVar9 = iVar9 + 1;
                ptr = ptr + 1;
              } while (iVar9 < ptr_00->numbands);
              ptr = ptr_00->bands;
              if (ptr == (jpc_dec_band_t *)0x0) goto LAB_0011e391;
            }
            jas_free(ptr);
          }
LAB_0011e391:
          uVar3 = uVar3 + 1;
          ptr_00 = ptr_00 + 1;
        } while (uVar3 < pjVar5->numrlvls);
        ptr_00 = pjVar5->rlvls;
      }
      if (ptr_00 != (jpc_dec_rlvl_t *)0x0) {
        jas_free(ptr_00);
      }
      if (pjVar5->data != (jas_matrix_t *)0x0) {
        jas_matrix_destroy(pjVar5->data);
      }
      if (pjVar5->tsfb != (jpc_tsfb_t *)0x0) {
        jpc_tsfb_destroy(pjVar5->tsfb);
      }
      iVar7 = iVar7 + 1;
      pjVar5 = pjVar5 + 1;
    } while (iVar7 < dec->numcomps);
  }
  if (tile->cp != (jpc_dec_cp_t *)0x0) {
    jpc_dec_cp_destroy(tile->cp);
  }
  if (tile->tcomps != (jpc_dec_tcomp_t *)0x0) {
    jas_free(tile->tcomps);
  }
  if (tile->pi != (jpc_pi_t *)0x0) {
    jpc_pi_destroy(tile->pi);
  }
  if (tile->pkthdrstream != (jas_stream_t *)0x0) {
    jas_stream_close(tile->pkthdrstream);
  }
  if (tile->pptstab != (jpc_ppxstab_t *)0x0) {
    jpc_ppxstab_destroy(tile->pptstab);
  }
  tile->state = 3;
  return (int)tile;
}

Assistant:

static int jpc_dec_tilefini(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	int compno;
	int bandno;
	unsigned rlvlno;
	jpc_dec_band_t *band;
	jpc_dec_rlvl_t *rlvl;
	int prcno;
	jpc_dec_prc_t *prc;
	jpc_dec_seg_t *seg;
	jpc_dec_cblk_t *cblk;
	int cblkno;

	if (tile->tcomps) {

		for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
		  ++compno, ++tcomp) {
			for (rlvlno = 0, rlvl = tcomp->rlvls; rlvlno < tcomp->numrlvls;
			  ++rlvlno, ++rlvl) {
				if (!rlvl->bands) {
					continue;
				}
				for (bandno = 0, band = rlvl->bands; bandno < rlvl->numbands;
				  ++bandno, ++band) {
					if (band->prcs) {
						for (prcno = 0, prc = band->prcs; prcno <
						  rlvl->numprcs; ++prcno, ++prc) {
							if (!prc->cblks) {
								continue;
							}
							for (cblkno = 0, cblk = prc->cblks; cblkno <
							  prc->numcblks; ++cblkno, ++cblk) {

								while (cblk->segs.head) {
									seg = cblk->segs.head;
									jpc_seglist_remove(&cblk->segs, seg);
									jpc_seg_destroy(seg);
								}
								jas_matrix_destroy(cblk->data);
								if (cblk->mqdec) {
									jpc_mqdec_destroy(cblk->mqdec);
								}
								if (cblk->nulldec) {
									jpc_bitstream_close(cblk->nulldec);
								}
								if (cblk->flags) {
									jas_matrix_destroy(cblk->flags);
								}
							}
							if (prc->incltagtree) {
								jpc_tagtree_destroy(prc->incltagtree);
							}
							if (prc->numimsbstagtree) {
								jpc_tagtree_destroy(prc->numimsbstagtree);
							}
							if (prc->cblks) {
								jas_free(prc->cblks);
							}
						}
					}
					if (band->data) {
						jas_matrix_destroy(band->data);
					}
					if (band->prcs) {
						jas_free(band->prcs);
					}
				}
				if (rlvl->bands) {
					jas_free(rlvl->bands);
				}
			}
			if (tcomp->rlvls) {
				jas_free(tcomp->rlvls);
			}
			if (tcomp->data) {
				jas_matrix_destroy(tcomp->data);
			}
			if (tcomp->tsfb) {
				jpc_tsfb_destroy(tcomp->tsfb);
			}
		}
	}

	if (tile->cp) {
		jpc_dec_cp_destroy(tile->cp);
		//tile->cp = 0;
	}
	if (tile->tcomps) {
		jas_free(tile->tcomps);
		//tile->tcomps = 0;
	}
	if (tile->pi) {
		jpc_pi_destroy(tile->pi);
		//tile->pi = 0;
	}
	if (tile->pkthdrstream) {
		jas_stream_close(tile->pkthdrstream);
		//tile->pkthdrstream = 0;
	}
	if (tile->pptstab) {
		jpc_ppxstab_destroy(tile->pptstab);
		//tile->pptstab = 0;
	}

	tile->state = JPC_TILE_DONE;

	return 0;
}